

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

char * ImParseFormatTrimDecorations(char *fmt,char *buf,size_t buf_size)

{
  char *fmt_00;
  char *pcVar1;
  unsigned_long count;
  char *fmt_end;
  char *fmt_start;
  size_t buf_size_local;
  char *buf_local;
  char *fmt_local;
  
  fmt_00 = ImParseFormatFindStart(fmt);
  fmt_local = fmt;
  if ((*fmt_00 == '%') &&
     (pcVar1 = ImParseFormatFindEnd(fmt_00), fmt_local = fmt_00, *pcVar1 != '\0')) {
    count = ImMin<unsigned_long>((unsigned_long)(pcVar1 + (1 - (long)fmt_00)),buf_size);
    ImStrncpy(buf,fmt_00,count);
    fmt_local = buf;
  }
  return fmt_local;
}

Assistant:

const char* ImParseFormatTrimDecorations(const char* fmt, char* buf, size_t buf_size)
{
    const char* fmt_start = ImParseFormatFindStart(fmt);
    if (fmt_start[0] != '%')
        return fmt;
    const char* fmt_end = ImParseFormatFindEnd(fmt_start);
    if (fmt_end[0] == 0) // If we only have leading decoration, we don't need to copy the data.
        return fmt_start;
    ImStrncpy(buf, fmt_start, ImMin((size_t)(fmt_end - fmt_start) + 1, buf_size));
    return buf;
}